

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,char *catchTag)

{
  BinaryenIndex BVar1;
  string_view local_30;
  
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe86,
                  "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
  }
  if (catchTag != (char *)0x0) {
    BVar1 = *(BinaryenIndex *)(expr + 3);
    wasm::Name::Name((Name *)&local_30,catchTag);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&expr[2].type,(Name)local_30)
    ;
    return BVar1;
  }
  __assert_fail("catchTag",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe87,
                "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
}

Assistant:

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,
                                        const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(catchTag);
  auto& list = static_cast<Try*>(expression)->catchTags;
  auto index = list.size();
  list.push_back(catchTag);
  return index;
}